

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void anon_unknown.dwarf_21986b::writeFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo,
               Compression pCompression)

{
  uint pNbChannels;
  Channel *pCVar1;
  Slice *pSVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined **ppuVar9;
  int pWidth_local;
  int pHeight_local;
  undefined **local_150;
  StringVector multiView;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  OutputFile lFile;
  FrameBuffer lOutputFrameBuffer;
  Array2D<Imath_3_2::half> lPixels;
  Header header;
  Array2D<Imath_3_2::half> lPixelsLeft;
  
  pNbChannels = *(uint *)("\t\tRGBA file to RGBA framebuffer" + (long)(int)pImageType * 4 + 0x1f);
  uVar7 = (ulong)pNbChannels;
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
            (&lPixels,(long)pHeight,(long)(int)(pNbChannels * pWidth));
  fillPixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
              (&lPixelsLeft,(long)pHeight,(long)(int)(pNbChannels * pWidth));
    fillPixels(&pHeight_local,&pWidth_local,&lPixelsLeft,pNbChannels,true);
    local_120._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              (&header,pWidth,pHeight,1.0,(Vec2 *)&local_120,1.0,INCREASING_Y,pCompression);
    puVar8 = &(anonymous_namespace)::CHANNEL_NAMES;
    local_150 = &(anonymous_namespace)::CHANNEL_NAMES_LEFT;
    for (lVar5 = 0; uVar7 * 8 != lVar5; lVar5 = lVar5 + 8) {
      pcVar4 = (char *)Imf_3_2::Header::channels();
      pCVar1 = *(Channel **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar5);
      Imf_3_2::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar4,pCVar1);
      pcVar4 = (char *)Imf_3_2::Header::channels();
      pCVar1 = *(Channel **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar5);
      Imf_3_2::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar4,pCVar1);
    }
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"right",(allocator<char> *)&lOutputFrameBuffer);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               &local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"left",(allocator<char> *)&lOutputFrameBuffer);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               &local_120);
    std::__cxx11::string::~string((string *)&local_120);
    Imf_3_2::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::TypedAttribute((vector *)&local_120);
    Imf_3_2::Header::insert((char *)&header,(Attribute *)"multiView");
    Imf_3_2::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       *)&local_120);
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile(&lFile,pFilename,&header,iVar3);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar7 = uVar7 * 2;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 2) {
      pSVar2 = (Slice *)*puVar8;
      Imf_3_2::Slice::Slice
                ((Slice *)&local_120,HALF,(char *)((long)&(lPixels._data)->_h + uVar6),uVar7,
                 (long)pWidth * uVar7,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar2);
      pSVar2 = (Slice *)*local_150;
      Imf_3_2::Slice::Slice
                ((Slice *)&local_120,HALF,(char *)((long)&(lPixelsLeft._data)->_h + uVar6),uVar7,
                 (long)pWidth * uVar7,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar2);
      local_150 = local_150 + 1;
      puVar8 = puVar8 + 1;
    }
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&lFile);
    Imf_3_2::OutputFile::writePixels((int)&lFile);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_3_2::OutputFile::~OutputFile(&lFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&multiView);
    Imf_3_2::Header::~Header(&header);
    Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&lPixelsLeft);
  }
  else {
    local_120._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              (&header,pWidth,pHeight,1.0,(Vec2 *)&local_120,1.0,INCREASING_Y,pCompression);
    local_150 = (undefined **)(uVar7 * 8);
    puVar8 = &(anonymous_namespace)::CHANNEL_NAMES;
    for (ppuVar9 = (undefined **)0x0; local_150 != ppuVar9; ppuVar9 = ppuVar9 + 1) {
      pcVar4 = (char *)Imf_3_2::Header::channels();
      pCVar1 = (Channel *)ppuVar9[0x3a880];
      Imf_3_2::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar4,pCVar1);
    }
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile((OutputFile *)&multiView,pFilename,&header,iVar3);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar7 = uVar7 * 2;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 2) {
      pSVar2 = (Slice *)*puVar8;
      Imf_3_2::Slice::Slice
                ((Slice *)&local_120,HALF,(char *)((long)&(lPixels._data)->_h + uVar6),uVar7,
                 (long)pWidth * uVar7,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar2);
      puVar8 = puVar8 + 1;
    }
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&multiView);
    Imf_3_2::OutputFile::writePixels((int)&multiView);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_3_2::OutputFile::~OutputFile((OutputFile *)&multiView);
    Imf_3_2::Header::~Header(&header);
  }
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&lPixels);
  return;
}

Assistant:

void
writeFile (
    const char  pFilename[],
    int         pHeight,
    int         pWidth,
    EImageType  pImageType,
    bool        pIsStereo,
    Compression pCompression)
{
    const int     lNbChannels = getNbChannels (pImageType);
    Array2D<half> lPixels;

    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    fillPixels (pHeight, pWidth, lPixels, lNbChannels, false);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;

        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        fillPixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);

        writePixels (
            pFilename,
            pHeight,
            pWidth,
            lPixels,
            lPixelsLeft,
            lNbChannels,
            pCompression);
    }
    else
    {
        writePixels (
            pFilename, pHeight, pWidth, lPixels, lNbChannels, pCompression);
    }
}